

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O3

Package * __thiscall
chatra::Reader::readValidIdType<chatra::PackageId,chatra::Package>
          (Reader *this,Reader *r,IdPool<chatra::PackageId,_chatra::Package> *pool)

{
  PackageId id;
  Package *pPVar1;
  undefined8 *puVar2;
  
  id = readRawInteger<unsigned_long>(r);
  if (id != 0xffffffffffffffff) {
    pPVar1 = IdPool<chatra::PackageId,_chatra::Package>::ref(pool,id);
    if (pPVar1 != (Package *)0x0) {
      return pPVar1;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[1] = puVar2 + 3;
  *(undefined1 *)(puVar2 + 3) = 0;
  *puVar2 = &PTR__NativeException_00242de8;
  __cxa_throw(puVar2,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

ValueType* readValidIdType(Reader& r, IdPool<KeyType, ValueType>& pool) {
		auto* value = readIdType(r, pool);
		if (value == nullptr)
			throw IllegalArgumentException();
		return value;
	}